

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MemoryLeakDetectorTest_TwoAllocOneFreeOneLeakReverseOrder_TestShell::createTest
          (TEST_MemoryLeakDetectorTest_TwoAllocOneFreeOneLeakReverseOrder_TestShell *this)

{
  TEST_MemoryLeakDetectorTest_TwoAllocOneFreeOneLeakReverseOrder_Test *this_00;
  TEST_MemoryLeakDetectorTest_TwoAllocOneFreeOneLeakReverseOrder_TestShell *this_local;
  
  this_00 = (TEST_MemoryLeakDetectorTest_TwoAllocOneFreeOneLeakReverseOrder_Test *)
            operator_new(0x20,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
                         ,0xfd);
  TEST_MemoryLeakDetectorTest_TwoAllocOneFreeOneLeakReverseOrder_Test::
  TEST_MemoryLeakDetectorTest_TwoAllocOneFreeOneLeakReverseOrder_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MemoryLeakDetectorTest, TwoAllocOneFreeOneLeakReverseOrder)
{
    char* mem = detector->allocMemory(defaultNewAllocator(), 4);
    char* mem2 = detector->allocMemory(defaultNewAllocator(), 12);
    detector->deallocMemory(defaultNewAllocator(), mem2);
    detector->stopChecking();
    SimpleString output = detector->report(mem_leak_period_checking);
    LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_checking));
    CHECK(!output.contains("size: 12"));
    CHECK(output.contains("size: 4"));
    PlatformSpecificFree(mem);
}